

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_control.c
# Opt level: O3

int volume_control_segment_set_out
              (uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  int iVar1;
  
  if (field == 0) {
    if (location == 1) {
      *(void **)((long)segment->data + 0x18) = buffer;
    }
    else {
      if (location != 0) {
        iVar1 = 6;
        goto LAB_0014771d;
      }
      *(void **)((long)segment->data + 0x10) = buffer;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = 7;
LAB_0014771d:
    mixed_err(iVar1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int volume_control_segment_set_out(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct volume_control_segment_data *data = (struct volume_control_segment_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    switch(location){
    case MIXED_LEFT: data->out[MIXED_LEFT] = (struct mixed_buffer *)buffer; return 1;
    case MIXED_RIGHT: data->out[MIXED_RIGHT] = (struct mixed_buffer *)buffer; return 1;
    default: mixed_err(MIXED_INVALID_LOCATION); return 0; break;
    }
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}